

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# physical_insert.cpp
# Opt level: O3

void duckdb::CheckDistinctnessInternal
               (ValidityMask *valid,vector<std::reference_wrapper<duckdb::Vector>,_true> *sort_keys,
               idx_t count,
               map<unsigned_long,_duckdb::vector<unsigned_long,_true>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_duckdb::vector<unsigned_long,_true>_>_>_>
               *result)

{
  unsigned_long *puVar1;
  pointer prVar2;
  data_ptr_t pdVar3;
  iterator __position;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var4;
  byte bVar5;
  ulong uVar6;
  key_type kVar7;
  element_type *peVar8;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var9;
  bool bVar10;
  vector<unsigned_long,std::allocator<unsigned_long>> *this;
  _Head_base<0UL,_unsigned_long_*,_false> _Var11;
  TemplatedValidityData<unsigned_long> *pTVar12;
  bool bVar13;
  reference_wrapper<duckdb::Vector> *sort_key;
  pointer prVar14;
  vector<std::reference_wrapper<duckdb::Vector>,_true> *__range3;
  ulong local_68;
  key_type local_60;
  element_type *local_58;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Stack_50;
  idx_t local_48;
  buffer_ptr<ValidityBuffer> *local_40;
  map<unsigned_long,_duckdb::vector<unsigned_long,_true>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_duckdb::vector<unsigned_long,_true>_>_>_>
  *local_38;
  
  local_60 = 0;
  if (count != 0) {
    local_40 = &(valid->super_TemplatedValidityMask<unsigned_long>).validity_data;
    local_38 = result;
    do {
      local_68 = local_60 + 1;
      if (local_68 < count) {
        bVar13 = false;
        do {
          while ((puVar1 = (valid->super_TemplatedValidityMask<unsigned_long>).validity_mask,
                 puVar1 == (unsigned_long *)0x0 ||
                 ((puVar1[local_68 >> 6] >> (local_68 & 0x3f) & 1) != 0))) {
            prVar2 = (sort_keys->
                     super_vector<std::reference_wrapper<duckdb::Vector>,_std::allocator<std::reference_wrapper<duckdb::Vector>_>_>
                     ).
                     super__Vector_base<std::reference_wrapper<duckdb::Vector>,_std::allocator<std::reference_wrapper<duckdb::Vector>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish;
            for (prVar14 = (sort_keys->
                           super_vector<std::reference_wrapper<duckdb::Vector>,_std::allocator<std::reference_wrapper<duckdb::Vector>_>_>
                           ).
                           super__Vector_base<std::reference_wrapper<duckdb::Vector>,_std::allocator<std::reference_wrapper<duckdb::Vector>_>_>
                           ._M_impl.super__Vector_impl_data._M_start; prVar14 != prVar2;
                prVar14 = prVar14 + 1) {
              pdVar3 = prVar14->_M_data->data;
              bVar10 = string_t::operator==
                                 ((string_t *)(pdVar3 + local_60 * 0x10),
                                  (string_t *)(pdVar3 + local_68 * 0x10));
              if (!bVar10) goto LAB_00befa2a;
            }
            this = (vector<unsigned_long,std::allocator<unsigned_long>> *)
                   ::std::
                   map<unsigned_long,_duckdb::vector<unsigned_long,_true>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_duckdb::vector<unsigned_long,_true>_>_>_>
                   ::operator[](local_38,&local_60);
            __position._M_current = *(unsigned_long **)(this + 8);
            if (__position._M_current == *(unsigned_long **)(this + 0x10)) {
              ::std::vector<unsigned_long,std::allocator<unsigned_long>>::
              _M_realloc_insert<unsigned_long_const&>(this,__position,&local_68);
            }
            else {
              *__position._M_current = local_68;
              *(unsigned_long **)(this + 8) = __position._M_current + 1;
            }
            uVar6 = local_68;
            _Var11._M_head_impl = (valid->super_TemplatedValidityMask<unsigned_long>).validity_mask;
            if (_Var11._M_head_impl == (unsigned_long *)0x0) {
              local_48 = (valid->super_TemplatedValidityMask<unsigned_long>).capacity;
              make_buffer<duckdb::TemplatedValidityData<unsigned_long>,unsigned_long&>
                        ((duckdb *)&local_58,&local_48);
              p_Var9 = p_Stack_50;
              peVar8 = local_58;
              local_58 = (element_type *)0x0;
              p_Stack_50 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
              p_Var4 = (valid->super_TemplatedValidityMask<unsigned_long>).validity_data.internal.
                       super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
                       ._M_refcount._M_pi;
              (valid->super_TemplatedValidityMask<unsigned_long>).validity_data.internal.
              super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
              ._M_ptr = peVar8;
              (valid->super_TemplatedValidityMask<unsigned_long>).validity_data.internal.
              super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
              ._M_refcount._M_pi = p_Var9;
              if ((p_Var4 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) &&
                 (::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var4),
                 p_Stack_50 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0)) {
                ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Stack_50);
              }
              pTVar12 = shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true>::operator->
                                  (local_40);
              _Var11._M_head_impl =
                   (pTVar12->owned_data).
                   super_unique_ptr<unsigned_long[],_std::default_delete<unsigned_long[]>_>._M_t.
                   super___uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>._M_t.
                   super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>.
                   super__Head_base<0UL,_unsigned_long_*,_false>._M_head_impl;
              (valid->super_TemplatedValidityMask<unsigned_long>).validity_mask =
                   _Var11._M_head_impl;
            }
            bVar5 = (byte)uVar6 & 0x3f;
            _Var11._M_head_impl[uVar6 >> 6] =
                 _Var11._M_head_impl[uVar6 >> 6] &
                 (-2L << bVar5 | 0xfffffffffffffffeU >> 0x40 - bVar5);
            local_68 = local_68 + 1;
            bVar13 = true;
            if (count <= local_68) goto LAB_00befb1a;
          }
LAB_00befa2a:
          local_68 = local_68 + 1;
        } while (local_68 < count);
        if (bVar13) {
LAB_00befb1a:
          kVar7 = local_60;
          _Var11._M_head_impl = (valid->super_TemplatedValidityMask<unsigned_long>).validity_mask;
          if (_Var11._M_head_impl == (unsigned_long *)0x0) {
            local_48 = (valid->super_TemplatedValidityMask<unsigned_long>).capacity;
            make_buffer<duckdb::TemplatedValidityData<unsigned_long>,unsigned_long&>
                      ((duckdb *)&local_58,&local_48);
            p_Var9 = p_Stack_50;
            peVar8 = local_58;
            local_58 = (element_type *)0x0;
            p_Stack_50 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
            p_Var4 = (valid->super_TemplatedValidityMask<unsigned_long>).validity_data.internal.
                     super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
                     ._M_refcount._M_pi;
            (valid->super_TemplatedValidityMask<unsigned_long>).validity_data.internal.
            super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
            ._M_ptr = peVar8;
            (valid->super_TemplatedValidityMask<unsigned_long>).validity_data.internal.
            super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
            ._M_refcount._M_pi = p_Var9;
            if ((p_Var4 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) &&
               (::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var4),
               p_Stack_50 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0)) {
              ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Stack_50);
            }
            pTVar12 = shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true>::operator->
                                (local_40);
            _Var11._M_head_impl =
                 (pTVar12->owned_data).
                 super_unique_ptr<unsigned_long[],_std::default_delete<unsigned_long[]>_>._M_t.
                 super___uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>._M_t.
                 super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>.
                 super__Head_base<0UL,_unsigned_long_*,_false>._M_head_impl;
            (valid->super_TemplatedValidityMask<unsigned_long>).validity_mask = _Var11._M_head_impl;
          }
          bVar5 = (byte)kVar7 & 0x3f;
          _Var11._M_head_impl[kVar7 >> 6] =
               _Var11._M_head_impl[kVar7 >> 6] &
               (-2L << bVar5 | 0xfffffffffffffffeU >> 0x40 - bVar5);
        }
      }
      local_60 = local_60 + 1;
    } while (local_60 < count);
  }
  return;
}

Assistant:

static void CheckDistinctnessInternal(ValidityMask &valid, vector<reference<Vector>> &sort_keys, idx_t count,
                                      map<idx_t, vector<idx_t>> &result) {
	for (idx_t i = 0; i < count; i++) {
		bool has_conflicts = false;
		for (idx_t j = i + 1; j < count; j++) {
			if (!valid.RowIsValid(j)) {
				// Already a conflict
				continue;
			}
			bool matches = true;
			for (auto &sort_key : sort_keys) {
				auto &this_row = FlatVector::GetData<string_t>(sort_key.get())[i];
				auto &other_row = FlatVector::GetData<string_t>(sort_key.get())[j];
				if (this_row != other_row) {
					matches = false;
					break;
				}
			}
			if (matches) {
				auto &row_ids = result[i];
				has_conflicts = true;
				row_ids.push_back(j);
				valid.SetInvalid(j);
			}
		}
		if (has_conflicts) {
			valid.SetInvalid(i);
		}
	}
}